

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
::parallel_hash_set<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
           *this,size_t *p)

{
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)this,*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x48),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x90),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0xd8),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x120),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x168),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x1b0),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x1f8),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x240),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x288),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x2d0),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x318),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x360),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x3a8),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x3f0),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set((raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                  *)(this + 0x438),*p,(hasher *)p[1],(key_equal *)p[2],(allocator_type *)p[3]);
  return;
}

Assistant:

parallel_hash_set(typename Inner::Params const &p,
                      phmap::index_sequence<i...>) : sets_{((void)i, p)...}
    {}